

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

void __thiscall cmServerResponse::SetData(cmServerResponse *this,Value *data)

{
  bool bVar1;
  Value *pVVar2;
  Value local_78;
  allocator<char> local_39;
  string local_38;
  Value *local_18;
  Value *data_local;
  cmServerResponse *this_local;
  
  local_18 = data;
  data_local = (Value *)this;
  if (this->m_Payload != PAYLOAD_UNKNOWN) {
    __assert_fail("this->m_Payload == PAYLOAD_UNKNOWN",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServerProtocol.cxx"
                  ,0x57,"void cmServerResponse::SetData(const Json::Value &)");
  }
  pVVar2 = Json::Value::operator[](data,&kCOOKIE_KEY_abi_cxx11_);
  bVar1 = Json::Value::isNull(pVVar2);
  if (bVar1) {
    pVVar2 = Json::Value::operator[](local_18,&kTYPE_KEY_abi_cxx11_);
    bVar1 = Json::Value::isNull(pVVar2);
    if (bVar1) {
      this->m_Payload = PAYLOAD_DATA;
      Json::Value::Value(&local_78,local_18);
      Json::Value::operator=(&this->m_Data,&local_78);
      Json::Value::~Value(&local_78);
      return;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Response contains cookie or type field.",&local_39);
  SetError(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void cmServerResponse::SetData(const Json::Value& data)
{
  assert(this->m_Payload == PAYLOAD_UNKNOWN);
  if (!data[kCOOKIE_KEY].isNull() || !data[kTYPE_KEY].isNull()) {
    this->SetError("Response contains cookie or type field.");
    return;
  }
  this->m_Payload = PAYLOAD_DATA;
  this->m_Data = data;
}